

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_get_metaonly_byseq(fdb_kvs_handle *handle,fdb_doc *doc)

{
  ulong uVar1;
  void *pvVar2;
  size_t sVar3;
  docio_length len;
  bool bVar4;
  uint uVar5;
  int64_t iVar6;
  size_t sVar7;
  undefined1 *puVar8;
  void *pvVar9;
  undefined1 local_118 [8];
  fdb_doc *doc_00;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  uint8_t in_stack_fffffffffffffefe;
  uint8_t in_stack_fffffffffffffeff;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  filemgr *pfStack_e0;
  int size_chunk;
  int64_t body_offset;
  bool alloc_meta;
  uint64_t *puStack_d0;
  bool alloc_key;
  fdb_kvs_id_t _kv_id;
  undefined1 *puStack_c0;
  hbtrie_result hr;
  uint8_t *kv_seqnum;
  int size_seq;
  int size_id;
  size_t key_len;
  _fdb_key_cmp_info cmp_info;
  fdb_txn *txn;
  fdb_seqnum_t _seqnum;
  btree_result br;
  fdb_status wr;
  filemgr *wal_file;
  docio_handle *dhandle;
  docio_object _doc;
  uint64_t offset;
  fdb_doc *doc_local;
  fdb_kvs_handle *handle_local;
  
  puVar8 = &stack0xfffffffffffffef8;
  docio_object::docio_object
            ((docio_object *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  _br = (filemgr *)0x0;
  _seqnum._0_4_ = BTREE_RESULT_FAIL;
  if (handle == (fdb_kvs_handle *)0x0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else if ((doc == (fdb_doc *)0x0) || (doc->seqnum == 0xffffffffffffffff)) {
    handle_local._4_4_ = FDB_RESULT_INVALID_ARGS;
  }
  else if ((handle->config).seqtree_opt == '\x01') {
    doc_00 = (fdb_doc *)0x13e17f;
    bVar4 = atomic_cas_uint8_t((atomic<unsigned_char> *)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                               in_stack_fffffffffffffeff,in_stack_fffffffffffffefe);
    if (bVar4) {
      if (handle->shandle == (snap_handle *)0x0) {
        doc_00 = (fdb_doc *)0x13e1aa;
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
        cmp_info.kvs = (kvs_info *)handle->fhandle->root->txn;
        if ((fdb_txn *)cmp_info.kvs == (fdb_txn *)0x0) {
          cmp_info.kvs = (kvs_info *)&handle->file->global_txn;
        }
      }
      else {
        cmp_info.kvs = (kvs_info *)handle->shandle->snap_txn;
      }
      key_len = *(size_t *)&handle->kvs_config;
      cmp_info.kvs_config._0_8_ = (handle->kvs_config).custom_cmp;
      cmp_info.kvs_config.custom_cmp =
           (fdb_custom_cmp_variable)(handle->kvs_config).custom_cmp_param;
      cmp_info.kvs_config.custom_cmp_param = handle->kvs;
      _br = handle->file;
      wal_file = (filemgr *)handle->dhandle;
      _size_seq = doc->keylen;
      doc->keylen = 0;
      if (handle->kvs == (kvs_info *)0x0) {
        _seqnum._4_4_ =
             wal_find((fdb_txn *)
                      CONCAT17(body_offset._7_1_,CONCAT16(body_offset._6_1_,(undefined6)body_offset)
                              ),pfStack_e0,
                      (_fdb_key_cmp_info *)
                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (snap_handle *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (fdb_doc *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (uint64_t *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      else {
        _seqnum._4_4_ =
             wal_find_kv_id((fdb_txn *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                            ,(filemgr *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                            (_fdb_key_cmp_info *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                            (snap_handle *)
                            CONCAT17(in_stack_fffffffffffffeff,
                                     CONCAT16(in_stack_fffffffffffffefe,
                                              CONCAT24(in_stack_fffffffffffffefc,
                                                       in_stack_fffffffffffffef8))),doc_00,
                            puStack_d0);
      }
      doc->keylen = _size_seq;
      if (handle->shandle == (snap_handle *)0x0) {
        fdb_sync_db_header((fdb_kvs_handle *)CONCAT44(_doc.length.bodylen,_doc.length._0_4_));
      }
      atomic_incr_uint64_t
                ((atomic<unsigned_long> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT13(in_stack_fffffffffffffeff,
                          CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
      if (_seqnum._4_4_ == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root
                  ((fdb_kvs_handle *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        txn = (fdb_txn *)
              (doc->seqnum >> 0x38 | (doc->seqnum & 0xff000000000000) >> 0x28 |
               (doc->seqnum & 0xff0000000000) >> 0x18 | (doc->seqnum & 0xff00000000) >> 8 |
               (doc->seqnum & 0xff000000) << 8 | (doc->seqnum & 0xff0000) << 0x18 |
               (doc->seqnum & 0xff00) << 0x28 | doc->seqnum << 0x38);
        if (handle->kvs == (kvs_info *)0x0) {
          _seqnum._0_4_ = btree_find((handle->field_6).seqtree,&txn,&_doc.body);
          puVar8 = &stack0xfffffffffffffef8;
        }
        else {
          uVar1 = handle->kvs->id;
          uVar5 = (uint)uVar1;
          puStack_d0 = (uint64_t *)
                       (uVar1 >> 0x38 | (ulong)((uint)(uVar1 >> 0x28) & 0xff00) |
                        (ulong)((uint)(uVar1 >> 0x18) & 0xff0000) | (uVar1 & 0xff00000000) >> 8 |
                        (ulong)(uVar5 & 0xff000000) << 8 | (ulong)(uVar5 & 0xff0000) << 0x18 |
                        (ulong)(uVar5 & 0xff00) << 0x28 | uVar1 << 0x38);
          kv_seqnum._4_4_ = 8;
          kv_seqnum._0_4_ = 8;
          puStack_c0 = local_118;
          memcpy(local_118,&stack0xffffffffffffff30,8);
          memcpy(puStack_c0 + kv_seqnum._4_4_,&txn,(long)(int)kv_seqnum);
          _kv_id._4_4_ = hbtrie_find((handle->field_6).seqtrie,puStack_c0,
                                     kv_seqnum._4_4_ + (int)kv_seqnum,&_doc.body);
          if (_kv_id._4_4_ == HBTRIE_RESULT_SUCCESS) {
            _seqnum._0_4_ = BTREE_RESULT_SUCCESS;
          }
          puVar8 = local_118;
        }
        *(undefined8 *)(puVar8 + -8) = 0x13e55a;
        btreeblk_end(*(btreeblk_handle **)(puVar8 + 0x10));
        _doc.body = (void *)((ulong)_doc.body >> 0x38 |
                             ((ulong)_doc.body & 0xff000000000000) >> 0x28 |
                             ((ulong)_doc.body & 0xff0000000000) >> 0x18 |
                             ((ulong)_doc.body & 0xff00000000) >> 8 |
                             ((ulong)_doc.body & 0xff000000) << 8 |
                             ((ulong)_doc.body & 0xff0000) << 0x18 |
                             ((ulong)_doc.body & 0xff00) << 0x28 | (long)_doc.body << 0x38);
        *(undefined8 *)(puVar8 + -8) = 0x13e603;
        _fdb_release_dirty_root(*(fdb_kvs_handle **)(puVar8 + 8));
      }
      if (((_seqnum._4_4_ == FDB_RESULT_SUCCESS) && (_doc.body != (void *)0xffffffffffffffff)) ||
         ((btree_result)_seqnum != BTREE_RESULT_FAIL)) {
        if (handle->kvs == (kvs_info *)0x0) {
          _doc._16_8_ = doc->key;
          dhandle._0_2_ = (ushort)doc->keylen;
        }
        else {
          _doc.timestamp = 0;
          _doc._20_4_ = 0;
        }
        _doc.field_3 = (anon_union_8_2_18a01fae_for_docio_object_3)doc->meta;
        _doc.meta = doc->body;
        *(undefined8 *)(puVar8 + -8) = 0x13e6ab;
        iVar6 = docio_read_doc_key_meta
                          (*(docio_handle **)(puVar8 + 0xe0),*(uint64_t *)(puVar8 + 0xd8),
                           *(docio_object **)(puVar8 + 0xd0),(bool)puVar8[0xcf]);
        if (iVar6 < 1) {
          *(undefined8 *)(puVar8 + -8) = 0x13e6d3;
          atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar8 + 8),puVar8[7],puVar8[6]);
          if (iVar6 < 0) {
            handle_local._4_4_ = (fdb_status)iVar6;
          }
          else {
            handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
          }
        }
        else if ((void *)doc->seqnum == _doc.key) {
          if (handle->kvs == (kvs_info *)0x0) {
            doc->keylen = (ulong)(ushort)dhandle;
            doc->key = (void *)_doc._16_8_;
          }
          else {
            uVar5 = (uint)(handle->config).chunksize;
            doc->keylen = (long)(int)((ushort)dhandle - uVar5);
            if (doc->key == (void *)0x0) {
              doc->key = (void *)_doc._16_8_;
              pvVar2 = doc->key;
              pvVar9 = doc->key;
              sVar3 = doc->keylen;
              *(undefined8 *)(puVar8 + -8) = 0x13e7fe;
              memmove(pvVar2,(void *)((long)pvVar9 + (long)(int)uVar5),sVar3);
            }
            else {
              pvVar2 = doc->key;
              pvVar9 = (void *)(_doc._16_8_ + (long)(int)uVar5);
              sVar3 = doc->keylen;
              *(undefined8 *)(puVar8 + -8) = 0x13e7b8;
              memcpy(pvVar2,pvVar9,sVar3);
              *(undefined8 *)(puVar8 + -8) = 0x13e7ca;
              free_docio_object(*(docio_object **)(puVar8 + 8),puVar8[7],puVar8[6],puVar8[5]);
            }
          }
          doc->metalen = (ulong)dhandle._2_2_;
          doc->bodylen = (ulong)dhandle._4_4_;
          doc->meta = (void *)_doc.field_3;
          doc->body = _doc.meta;
          doc->deleted = (_doc.length.bodylen & 4) != 0;
          len.metalen = dhandle._2_2_;
          len.keylen = (ushort)dhandle;
          len.bodylen = dhandle._4_4_;
          len.bodylen_ondisk._0_2_ = _doc.length.keylen;
          len.bodylen_ondisk._2_2_ = _doc.length.metalen;
          len.flag = (undefined1)_doc.length.bodylen;
          len.checksum = _doc.length.bodylen._1_1_;
          len.reserved = _doc.length.bodylen._2_2_;
          *(undefined8 *)(puVar8 + -8) = 0x13e88c;
          sVar7 = _fdb_get_docsize(len);
          doc->size_ondisk = sVar7;
          doc->offset = (uint64_t)_doc.body;
          *(undefined8 *)(puVar8 + -8) = 0x13e8ba;
          atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar8 + 8),puVar8[7],puVar8[6]);
          handle_local._4_4_ = FDB_RESULT_SUCCESS;
        }
        else {
          *(undefined8 *)(puVar8 + -8) = 0x13e737;
          free_docio_object(*(docio_object **)(puVar8 + 8),puVar8[7],puVar8[6],puVar8[5]);
          *(undefined8 *)(puVar8 + -8) = 0x13e74e;
          atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar8 + 8),puVar8[7],puVar8[6]);
          handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
        }
      }
      else {
        *(undefined8 *)(puVar8 + -8) = 0x13e8da;
        atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar8 + 8),puVar8[7],puVar8[6]);
        handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
      }
    }
    else {
      handle_local._4_4_ = FDB_RESULT_HANDLE_BUSY;
    }
  }
  else {
    handle_local._4_4_ = FDB_RESULT_INVALID_CONFIG;
  }
  return handle_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_metaonly_byseq(fdb_kvs_handle *handle, fdb_doc *doc)
{
    uint64_t offset;
    struct docio_object _doc;
    struct docio_handle *dhandle;
    struct filemgr *wal_file = NULL;
    fdb_status wr;
    btree_result br = BTREE_RESULT_FAIL;
    fdb_seqnum_t _seqnum;
    fdb_txn *txn;
    struct _fdb_key_cmp_info cmp_info;

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc || doc->seqnum == SEQNUM_NOT_USED) {
        return FDB_RESULT_INVALID_ARGS;
    }

    // Sequence trees are a must for byseq operations
    if (handle->config.seqtree_opt != FDB_SEQTREE_USE) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);

        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;
    wal_file = handle->file;
    dhandle = handle->dhandle;

    // prevent searching by key in WAL if 'doc' is not empty
    size_t key_len = doc->keylen;
    doc->keylen = 0;
    if (handle->kvs) {
        wr = wal_find_kv_id(txn, wal_file, handle->kvs->id, &cmp_info,
                            handle->shandle, doc, &offset);
    } else {
        wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, doc, &offset);
    }
    doc->keylen = key_len;
    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    if (wr == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root(handle);

        _seqnum = _endian_encode(doc->seqnum);
        if (handle->kvs) {
            int size_id, size_seq;
            uint8_t *kv_seqnum;
            hbtrie_result hr;
            fdb_kvs_id_t _kv_id;

            _kv_id = _endian_encode(handle->kvs->id);
            size_id = sizeof(fdb_kvs_id_t);
            size_seq = sizeof(fdb_seqnum_t);
            kv_seqnum = alca(uint8_t, size_id + size_seq);
            memcpy(kv_seqnum, &_kv_id, size_id);
            memcpy(kv_seqnum + size_id, &_seqnum, size_seq);
            hr = hbtrie_find(handle->seqtrie, (void *)kv_seqnum,
                             size_id + size_seq, (void *)&offset);
            br = (hr == HBTRIE_RESULT_SUCCESS)?(BTREE_RESULT_SUCCESS):(br);
        } else {
            br = btree_find(handle->seqtree, (void *)&_seqnum, (void *)&offset);
        }
        btreeblk_end(handle->bhandle);
        offset = _endian_decode(offset);

        _fdb_release_dirty_root(handle);
    }

    if ((wr == FDB_RESULT_SUCCESS && offset != BLK_NOT_FOUND) ||
         br != BTREE_RESULT_FAIL) {
        bool alloc_key, alloc_meta;
        if (!handle->kvs) { // single KVS mode
            _doc.key = doc->key;
            _doc.length.keylen = doc->keylen;
            alloc_key = doc->key ? false : true;
        } else {
            _doc.key = NULL;
            alloc_key = true;
        }
        _doc.meta = doc->meta;
        alloc_meta = doc->meta ? false : true;
        _doc.body = doc->body;

        int64_t body_offset = docio_read_doc_key_meta(dhandle, offset, &_doc,
                                                       true);
        if (body_offset <= 0 ) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return body_offset < 0 ? (fdb_status)body_offset : FDB_RESULT_KEY_NOT_FOUND;
        }
        if (doc->seqnum != _doc.seqnum) {
            free_docio_object(&_doc, alloc_key, alloc_meta, false);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        if (handle->kvs) {
            int size_chunk = handle->config.chunksize;
            doc->keylen = _doc.length.keylen - size_chunk;
            if (doc->key) { // doc->key is given by user
                memcpy(doc->key, (uint8_t*)_doc.key + size_chunk, doc->keylen);
                free_docio_object(&_doc, 1, 0, 0);
            } else {
                doc->key = _doc.key;
                memmove(doc->key, (uint8_t*)doc->key + size_chunk, doc->keylen);
            }
        } else {
            doc->keylen = _doc.length.keylen;
            doc->key = _doc.key;
        }
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}